

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

TextureFormatInfoExt * __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::GetTextureFormatInfoExt
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,TEXTURE_FORMAT TexFormat)

{
  bool bVar1;
  Char *pCVar2;
  reference local_90;
  reference local_80;
  undefined1 local_70 [8];
  string msg_1;
  TextureFormatInfoExt *TexFmtInfo;
  undefined1 local_38 [8];
  string msg;
  TEXTURE_FORMAT TexFormat_local;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._14_2_ = TexFormat;
  if (TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB < TexFormat) {
    FormatString<char[28]>((string *)local_38,(char (*) [28])"Texture format out of range");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetTextureFormatInfoExt",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x119);
    std::__cxx11::string::~string((string *)local_38);
  }
  msg_1.field_2._8_8_ =
       std::
       vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
       ::operator[](&this->m_TextureFormatsInfo,(ulong)(ushort)msg.field_2._14_2_);
  if ((((reference)msg_1.field_2._8_8_)->super_TextureFormatInfo).super_TextureFormatAttribs.Format
      != msg.field_2._14_2_) {
    FormatString<char[20]>((string *)local_70,(char (*) [20])"Sanity check failed");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetTextureFormatInfoExt",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x11b);
    std::__cxx11::string::~string((string *)local_70);
  }
  local_80 = std::vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::
             operator[](&this->m_TexFmtInfoInitFlags,(ulong)(ushort)msg.field_2._14_2_);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_80);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    if ((*(byte *)(msg_1.field_2._8_8_ + 0x10) & 1) != 0) {
      (*(this->super_ObjectBase<Diligent::IRenderDeviceVk>).
        super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.super_IRenderDevice.
        super_IObject._vptr_IObject[0x2d])(this,(ulong)(ushort)msg.field_2._14_2_);
    }
    local_90 = std::vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::
               operator[](&this->m_TexFmtInfoInitFlags,(ulong)(ushort)msg.field_2._14_2_);
    std::_Bit_reference::operator=(&local_90,true);
  }
  return (TextureFormatInfoExt *)msg_1.field_2._8_8_;
}

Assistant:

GetTextureFormatInfoExt(TEXTURE_FORMAT TexFormat) override final
    {
        VERIFY(TexFormat >= TEX_FORMAT_UNKNOWN && TexFormat < TEX_FORMAT_NUM_FORMATS, "Texture format out of range");
        const TextureFormatInfoExt& TexFmtInfo = m_TextureFormatsInfo[TexFormat];
        VERIFY(TexFmtInfo.Format == TexFormat, "Sanity check failed");
        if (!m_TexFmtInfoInitFlags[TexFormat])
        {
            if (TexFmtInfo.Supported)
                TestTextureFormat(TexFormat);
            m_TexFmtInfoInitFlags[TexFormat] = true;
        }
        return TexFmtInfo;
    }